

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.h
# Opt level: O0

void __thiscall
double_conversion::StringToDoubleConverter::StringToDoubleConverter
          (StringToDoubleConverter *this,int flags,double empty_string_value,
          double junk_string_value,char *infinity_symbol,char *nan_symbol,uc16 separator)

{
  uc16 separator_local;
  char *nan_symbol_local;
  char *infinity_symbol_local;
  double junk_string_value_local;
  double empty_string_value_local;
  int flags_local;
  StringToDoubleConverter *this_local;
  
  this->flags_ = flags;
  this->empty_string_value_ = empty_string_value;
  this->junk_string_value_ = junk_string_value;
  this->infinity_symbol_ = infinity_symbol;
  this->nan_symbol_ = nan_symbol;
  this->separator_ = separator;
  return;
}

Assistant:

StringToDoubleConverter(int flags,
                          double empty_string_value,
                          double junk_string_value,
                          const char* infinity_symbol,
                          const char* nan_symbol,
                          uc16 separator = kNoSeparator)
      : flags_(flags),
        empty_string_value_(empty_string_value),
        junk_string_value_(junk_string_value),
        infinity_symbol_(infinity_symbol),
        nan_symbol_(nan_symbol),
        separator_(separator) {
  }